

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

void zcr_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  ulong uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  
  uVar1 = env->features;
  if (((uint)uVar1 >> 9 & 1) != 0) {
    uVar4 = 1;
    if ((env->v7m).exception == 0) {
      uVar4 = ~(env->v7m).control[(env->v7m).secure] & 1;
    }
    goto LAB_0061d633;
  }
  if (env->aarch64 != 0) {
    uVar4 = env->pstate >> 2 & 3;
    goto LAB_0061d633;
  }
  uVar4 = env->uncached_cpsr & 0x1f;
  if (uVar4 == 0x10) {
    uVar4 = 0;
    goto LAB_0061d633;
  }
  if (uVar4 == 0x16) {
LAB_0061d62e:
    uVar4 = 3;
  }
  else {
    if (uVar4 == 0x1a) {
      uVar4 = 2;
      goto LAB_0061d633;
    }
    if ((uVar1 >> 0x21 & 1) != 0) {
      if (uVar4 == 0x16) {
        uVar4 = 3;
        if (((uint)uVar1 >> 0x1c & 1) == 0) goto LAB_0061d633;
      }
      else if ((uVar1 & 0x10000000) == 0 && ((env->cp15).scr_el3 & 1) == 0) goto LAB_0061d62e;
    }
    uVar4 = 1;
  }
LAB_0061d633:
  uVar2 = sve_zcr_len_for_el_aarch64(env,uVar4);
  raw_write(env,ri,(ulong)((uint)value & 0xf));
  uVar3 = sve_zcr_len_for_el_aarch64(env,uVar4);
  if (uVar2 <= uVar3) {
    return;
  }
  aarch64_sve_narrow_vq_aarch64(env,uVar3 + 1);
  return;
}

Assistant:

static void zcr_write(CPUARMState *env, const ARMCPRegInfo *ri,
                      uint64_t value)
{
    int cur_el = arm_current_el(env);
    int old_len = sve_zcr_len_for_el(env, cur_el);
    int new_len;

    /* Bits other than [3:0] are RAZ/WI.  */
    QEMU_BUILD_BUG_ON(ARM_MAX_VQ > 16);
    raw_write(env, ri, value & 0xf);

    /*
     * Because we arrived here, we know both FP and SVE are enabled;
     * otherwise we would have trapped access to the ZCR_ELn register.
     */
    new_len = sve_zcr_len_for_el(env, cur_el);
    if (new_len < old_len) {
        aarch64_sve_narrow_vq(env, new_len + 1);
    }
}